

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
detail::try_get_range_size<std::vector<person,std::allocator<person>>>
          (detail *this,span<const_std::byte> buffer)

{
  long lVar1;
  byte **ppbVar2;
  size_t sVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  pair<unsigned_long,_bool> pVar5;
  bool local_a9;
  long local_a8;
  bool local_99;
  unsigned_long local_98;
  type_conflict1 *local_90;
  type *success;
  type *size;
  undefined1 local_78;
  span<const_std::byte> local_70;
  pair<unsigned_long,_bool> local_60;
  ulong local_50;
  size_t i;
  unsigned_long local_40;
  ulong local_38;
  size_t count;
  byte *data_begin;
  span<const_std::byte> buffer_local;
  undefined1 local_10;
  
  buffer_local.begin_ = buffer.begin_;
  data_begin = (byte *)this;
  ppbVar2 = span<const_std::byte>::begin((span<const_std::byte> *)&data_begin);
  count = (size_t)*ppbVar2;
  sVar3 = span<const_std::byte>::size((span<const_std::byte> *)&data_begin);
  if (sVar3 < 8) {
    local_40 = 0;
    i._7_1_ = 0;
    std::pair<unsigned_long,_bool>::pair<bool,_true>
              ((pair<unsigned_long,_bool> *)&buffer_local.end_,&local_40,(bool *)((long)&i + 7));
    uVar4 = extraout_RDX;
  }
  else {
    deserialize<unsigned_long>(&local_38,(span<const_std::byte> *)&data_begin);
    for (local_50 = 0; local_50 < local_38; local_50 = local_50 + 1) {
      span<std::byte_const>::span<span<std::byte_const>&,void>
                ((span<std::byte_const> *)&local_70,(span<const_std::byte> *)&data_begin);
      pVar5 = try_get_deserialized_size<person>(local_70);
      size = (type *)pVar5.first;
      local_78 = pVar5.second;
      local_60.first = (unsigned_long)size;
      local_60.second = (bool)local_78;
      success = (type *)std::get<0ul,unsigned_long,bool>(&local_60);
      local_90 = std::get<1ul,unsigned_long,bool>(&local_60);
      if ((*local_90 & 1U) == 0) {
        local_98 = 0;
        local_99 = false;
        std::pair<unsigned_long,_bool>::pair<bool,_true>
                  ((pair<unsigned_long,_bool> *)&buffer_local.end_,&local_98,&local_99);
        uVar4 = extraout_RDX_00;
        goto LAB_0011050f;
      }
      lVar1 = *(long *)success;
      ppbVar2 = span<const_std::byte>::begin((span<const_std::byte> *)&data_begin);
      *ppbVar2 = *ppbVar2 + lVar1;
    }
    ppbVar2 = span<const_std::byte>::begin((span<const_std::byte> *)&data_begin);
    local_a8 = (long)*ppbVar2 - count;
    local_a9 = true;
    std::pair<unsigned_long,_bool>::pair<long,_bool,_true>
              ((pair<unsigned_long,_bool> *)&buffer_local.end_,&local_a8,&local_a9);
    uVar4 = extraout_RDX_01;
  }
LAB_0011050f:
  pVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar5.second = (bool)local_10;
  pVar5.first = (unsigned_long)buffer_local.end_;
  return pVar5;
}

Assistant:

std::pair<size_t, bool> try_get_range_size(span<std::byte const> buffer) noexcept {
        auto const data_begin = buffer.begin();

        size_t count;
        if (buffer.size() < sizeof(count)) return { {}, false };
        deserialize(count, buffer);
        
        using value_type = typename range_traits<T>::value_type;
        if constexpr (serialization_category_v<value_type> == serialization_category::trivial) {
            auto const elements_size = count * sizeof(value_type);
            if (buffer.size() < elements_size) return { {}, false };
            buffer.begin() += elements_size;
        }
        else {
            for (size_t i = 0; i < count; ++i) {
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return { {}, false };
                buffer.begin() += size;
            }
        }
        return { buffer.begin() - data_begin, true };
    }